

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O0

void __thiscall
soplex::
SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scale(SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lp,bool persistent)

{
  Verbosity VVar1;
  element_type *this_00;
  SPxOut *t;
  SPxOut *_spxout;
  byte in_DL;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long *in_RDI;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  bool colFirst;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowratio;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  colratio;
  Verbosity old_verbosity;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff858;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff860;
  double in_stack_fffffffffffff868;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff870;
  undefined1 local_6d0 [80];
  undefined1 local_680 [80];
  undefined1 local_630 [80];
  undefined1 local_5e0 [80];
  undefined4 local_590;
  Verbosity local_58c;
  undefined1 local_588 [80];
  undefined1 local_538 [80];
  undefined1 local_4e8 [80];
  undefined1 local_498 [16];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb78;
  DataArray<int> *in_stack_fffffffffffffb80;
  DataArray<int> *in_stack_fffffffffffffb88;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffb90;
  undefined4 local_448;
  Verbosity local_444;
  undefined1 local_440 [80];
  undefined1 local_3f0 [80];
  undefined1 local_3a0 [80];
  undefined1 local_350 [80];
  undefined1 local_300 [80];
  undefined1 local_2b0 [80];
  undefined1 local_260 [80];
  undefined1 local_210 [80];
  undefined4 local_1c0;
  Verbosity local_1bc;
  byte local_1b5;
  Real local_198;
  undefined1 local_18c [80];
  undefined1 local_13c [80];
  undefined1 local_ec [80];
  undefined4 local_9c;
  Verbosity local_98;
  byte local_91;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_90;
  undefined8 local_80;
  Real *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  Real *local_8;
  
  local_91 = in_DL & 1;
  local_90 = in_RSI;
  if ((in_RDI[5] != 0) && (VVar1 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 2 < (int)VVar1)) {
    local_98 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    local_9c = 3;
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_9c);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_98);
  }
  (**(code **)*in_RDI)(in_RDI,local_90);
  (**(code **)(*in_RDI + 0x198))(local_ec,in_RDI,local_90);
  (**(code **)(*in_RDI + 0x1a0))(local_13c,in_RDI,local_90);
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_fffffffffffff858);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x5ad8bd);
  local_198 = Tolerances::epsilon(this_00);
  local_70 = local_18c;
  local_78 = &local_198;
  local_80 = 0;
  local_8 = local_78;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x5ad94c);
  local_1b5 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff858,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x5ad961);
  if ((in_RDI[5] != 0) && (VVar1 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar1)) {
    local_1bc = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    local_1c0 = 4;
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_1c0);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
    (*(local_90->
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[3])(local_210,local_90,1);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff858);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
    (*(local_90->
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[4])(local_260,local_90,1);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff858);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
    local_60 = local_2b0;
    local_68 = local_ec;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff858);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
    local_50 = local_300;
    local_58 = local_13c;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff858);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_1bc);
  }
  if ((local_1b5 & 1) == 0) {
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::rowSet(local_90);
    local_20 = local_3f0;
    local_28 = local_18c;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858);
    computeEquiExpVec(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                      in_stack_fffffffffffffb78);
    if ((*(byte *)((long)in_RDI + 0x21) & 1) != 0) {
      LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::colSet((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)(local_90 + 1));
      local_10 = local_440;
      local_18 = local_18c;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff860,in_stack_fffffffffffff858);
      computeEquiExpVec(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                        in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    }
  }
  else {
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::colSet((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)(local_90 + 1));
    local_40 = local_350;
    local_48 = local_18c;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858);
    computeEquiExpVec(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                      in_stack_fffffffffffffb78);
    if ((*(byte *)((long)in_RDI + 0x21) & 1) != 0) {
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::rowSet(local_90);
      local_30 = local_3a0;
      local_38 = local_18c;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff860,in_stack_fffffffffffff858);
      computeEquiExpVec(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                        in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    }
  }
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_90);
  if ((in_RDI[5] != 0) && (VVar1 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 4 < (int)VVar1)) {
    local_444 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    local_448 = 5;
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_448);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
    (**(code **)(*in_RDI + 0x188))(local_498);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff858);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
    (**(code **)(*in_RDI + 400))(local_4e8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff858);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
    (**(code **)(*in_RDI + 0x178))(local_538);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff858);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
    (**(code **)(*in_RDI + 0x180))(local_588);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff858);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_444);
  }
  if ((in_RDI[5] != 0) && (VVar1 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar1)) {
    local_58c = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    local_590 = 4;
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_590);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
    t = soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
    (*(local_90->
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[3])(local_5e0,local_90,0);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)t);
    _spxout = soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)t);
    (*(local_90->
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[4])(local_630,local_90,0);
    soplex::operator<<(_spxout,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)t);
    soplex::operator<<(_spxout,(char *)t);
    (**(code **)(*in_RDI + 0x198))(local_680,in_RDI,local_90);
    soplex::operator<<(_spxout,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)t);
    soplex::operator<<(_spxout,(char *)t);
    (**(code **)(*in_RDI + 0x1a0))(local_6d0,in_RDI,local_90);
    soplex::operator<<(_spxout,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)t);
    soplex::operator<<(_spxout,(_func_ostream_ptr_ostream_ptr *)t);
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_58c);
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Equilibrium scaling LP" <<
                 (persistent ? " (persistent)" : "") << std::endl;)

   this->setup(lp);

   /* We want to do the direction first, which has a lower maximal ratio,
    * since the lowest value in the scaled matrix is bounded from below by
    * the inverse of the maximum ratio of the direction that is done first
    * Example:
    *
    *                     Rowratio
    *            0.1  1   10
    *            10   1   10
    *
    * Colratio   100  1
    *
    * Row first =>         Col next =>
    *            0.1  1          0.1  1
    *            1    0.1        1    0.1
    *
    * Col first =>         Row next =>
    *            0.01 1          0.01 1
    *            1    1          1    1
    *
    */
   R colratio = this->maxColRatio(lp);
   R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   bool colFirst = colratio < rowratio;

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   if(colFirst)
   {
      computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);
   }
   else
   {
      computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);
   }

   /* scale */
   this->applyScaling(lp);

   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                 << " max= " << this->maxAbsRowscale()
                 << std::endl
                 << "Col scaling min= " << this->minAbsColscale()
                 << " max= " << this->maxAbsColscale()
                 << std::endl;)

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                 << " min= " << lp.minAbsNzo(false)
                 << " max= " << lp.maxAbsNzo(false)
                 << " col-ratio= " << this->maxColRatio(lp)
                 << " row-ratio= " << this->maxRowRatio(lp)
                 << std::endl;)

}